

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory.h
# Opt level: O0

double * Eigen::internal::conditional_aligned_new_auto<double,true>(size_t size)

{
  ulong in_RDI;
  double *result;
  undefined8 local_10;
  
  if (in_RDI == 0) {
    local_10 = (double *)0x0;
  }
  else {
    if (0x1fffffffffffffff < in_RDI) {
      throw_std_bad_alloc();
    }
    local_10 = (double *)conditional_aligned_malloc<true>(0x141bda);
  }
  return local_10;
}

Assistant:

EIGEN_DEVICE_FUNC inline T* conditional_aligned_new_auto(std::size_t size)
{
  if(size==0)
    return 0; // short-cut. Also fixes Bug 884
  check_size_for_overflow<T>(size);
  T *result = reinterpret_cast<T*>(conditional_aligned_malloc<Align>(sizeof(T)*size));
  if(NumTraits<T>::RequireInitialization)
  {
    EIGEN_TRY
    {
      construct_elements_of_array(result, size);
    }
    EIGEN_CATCH(...)
    {
      conditional_aligned_free<Align>(result);
      EIGEN_THROW;
    }
  }